

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_zenobian.cxx
# Opt level: O1

void __thiscall xray_re::se_turret_mgun::se_turret_mgun(se_turret_mgun *this)

{
  cse_alife_object::cse_alife_object((cse_alife_object *)this);
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_abstract_00246c60;
  cse_visual::cse_visual
            (&(this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
              super_cse_visual);
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_dynamic_object_visual_00246ce0;
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.super_cse_visual.
  _vptr_cse_visual = (_func_int **)&PTR__cse_alife_dynamic_object_visual_00246d48;
  cse_motion::cse_motion(&(this->super_cse_alife_helicopter).super_cse_motion);
  cse_ph_skeleton::cse_ph_skeleton(&(this->super_cse_alife_helicopter).super_cse_ph_skeleton);
  (this->super_cse_alife_helicopter).m_engine_sound._M_dataplus._M_p =
       (pointer)&(this->super_cse_alife_helicopter).m_engine_sound.field_2;
  (this->super_cse_alife_helicopter).m_engine_sound._M_string_length = 0;
  (this->super_cse_alife_helicopter).m_engine_sound.field_2._M_local_buf[0] = '\0';
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_helicopter_0024cfe8;
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.super_cse_visual.
  _vptr_cse_visual = (_func_int **)&PTR__se_turret_mgun_0024d050;
  (this->super_cse_alife_helicopter).super_cse_motion._vptr_cse_motion =
       (_func_int **)&PTR__se_turret_mgun_0024d078;
  (this->super_cse_alife_helicopter).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_turret_mgun_0024d0a0;
  this->m_health = 0.0;
  return;
}

Assistant:

se_turret_mgun::se_turret_mgun(): m_health(0) {}